

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::Test::RecordProperty(string *key,int value)

{
  Message value_message;
  allocator local_71;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  string local_68;
  string local_48;
  
  Message::Message((Message *)&local_70);
  std::ostream::operator<<(local_70.ptr_ + 0x10,value);
  internal::StringStreamToString(&local_68,local_70.ptr_);
  std::__cxx11::string::string((string *)&local_48,local_68._M_dataplus._M_p,&local_71);
  RecordProperty(key,&local_48);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_70);
  return;
}

Assistant:

void Test::RecordProperty(const std::string& key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}